

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.cpp
# Opt level: O2

void __thiscall Ray::Ray(Ray *this,vec3 *o,vec3 *d,float near,float far)

{
  undefined1 auVar1 [16];
  ulong local_20;
  float local_18;
  
  (this->invdir).field_0.field_0.z = 0.0;
  *(undefined8 *)((long)&(this->dir).field_0 + 4) = 0;
  *(undefined8 *)&(this->invdir).field_0 = 0;
  *(undefined8 *)&(this->origin).field_0 = 0;
  *(undefined8 *)((long)&(this->origin).field_0 + 8) = 0;
  (this->origin).field_0.field_0.x = (o->field_0).field_0.x;
  (this->origin).field_0.field_0.y = (o->field_0).field_0.y;
  (this->origin).field_0.field_0.z = (o->field_0).field_0.z;
  glm::normalize<float>((glm *)&local_20,d);
  (this->dir).field_0.field_0.z = local_18;
  *(ulong *)&(this->dir).field_0 = local_20;
  this->tMin = near;
  this->tMax = far;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = local_20;
  auVar1 = divps(_DAT_001091e0,auVar1);
  *(long *)&(this->invdir).field_0 = auVar1._0_8_;
  (this->invdir).field_0.field_0.z = 1.0 / local_18;
  this->sign[0] = auVar1._0_4_ < 0.0;
  this->sign[1] = auVar1._4_4_ < 0.0;
  this->sign[2] = 1.0 / local_18 < 0.0;
  return;
}

Assistant:

Ray::Ray(glm::vec3 o, glm::vec3 d, float near, float far) {
    origin = o; dir = glm::normalize(d); tMin = near; tMax = far;
    invdir.x = 1 / dir.x;
    invdir.y = 1 / dir.y;
    invdir.z = 1 / dir.z;
    sign[0] = (invdir.x < 0);
    sign[1] = (invdir.y < 0);
    sign[2] = (invdir.z < 0);
}